

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_writer.c
# Opt level: O3

int main(void)

{
  int iVar1;
  ssize_t sVar2;
  char data;
  char local_19;
  
  local_19 = ' ';
  unlink("/tmp/myfifo");
  iVar1 = mkfifo("/tmp/myfifo",0x180);
  if (iVar1 != 0) {
    perror("Cannot create fifo. Already existing?");
  }
  iVar1 = open("/tmp/myfifo",2);
  if (iVar1 != 0) {
    puts("Chatting below, digit # to quit");
    do {
      if (local_19 == '#') {
        return 0;
      }
      __isoc99_scanf("%c",&local_19);
      sVar2 = write(iVar1,&local_19,1);
    } while ((int)sVar2 != 0);
    main_cold_1();
    return 0;
  }
  main_cold_2();
  halt_baddata();
}

Assistant:

int main ()
{
    char data = ' ';
    size_t len = 0;     /* ignored when line = NULL */
    ssize_t read;
    char * myfifo = "/tmp/myfifo";
    unlink(myfifo);
    if (mkfifo(myfifo, S_IRUSR | S_IWUSR) != 0)
        perror("Cannot create fifo. Already existing?");
    
    int fd = open(myfifo, O_RDWR);
    if (fd == 0) 
    {
        perror("Cannot open fifo");
        unlink(myfifo);
        exit(1);
        
    }
    printf ("Chatting below, digit # to quit\n");
    while (data != '#') 
    {
    scanf("%c",&data);
    int nb = write(fd, &data,1);
        if (nb == 0)
        {
            fprintf(stderr,"Write error\n");
            exit(1);
        }
    }
    //close(fd);
    //unlink(myfifo);
   
    return 0;
    
}